

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtoken.cpp
# Opt level: O1

string * parse_util::get_token(string *__return_storage_ptr__,string *instr,string *open_par)

{
  long *local_40 [2];
  long local_30 [2];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::find((char *)instr,(ulong)(open_par->_M_dataplus)._M_p,0);
  std::__cxx11::string::find_first_not_of((char *)instr,0x11b432,0);
  std::__cxx11::string::substr((ulong)local_40,(ulong)instr);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_40);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

string get_token(const string &instr, const string &open_par)
    {
        string temp;

        string::size_type pos = instr.find(open_par);
        string::size_type pos1 = instr.find_first_not_of(" \n");

        temp = instr.substr(pos1, pos - pos1);

        return temp;
    }